

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_driver.cc
# Opt level: O3

void test_86(QPDF *pdf,char *arg2)

{
  long *plVar1;
  char cVar2;
  int iVar3;
  string utf8_val;
  QPDFObjectHandle h;
  string result;
  string utf16_val;
  long *local_b8;
  size_t local_b0;
  long local_a8 [2];
  long *local_98;
  size_t local_90;
  long local_88 [2];
  string local_78 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_70;
  undefined1 *local_68;
  size_t local_60;
  undefined1 local_58;
  undefined7 uStack_57;
  undefined4 *local_48;
  size_t local_40;
  undefined4 local_38;
  uint uStack_34;
  
  local_98 = local_88;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"\x1f","");
  local_38 = 0x1f00fffe;
  local_40 = 4;
  uStack_34 = uStack_34 & 0xffffff00;
  local_60 = 0;
  local_58 = 0;
  local_68 = &local_58;
  local_48 = &local_38;
  cVar2 = QUtil::utf8_to_ascii((string *)&local_98,(string *)&local_68,'?');
  if (cVar2 == '\0') {
    __assert_fail("QUtil::utf8_to_ascii(utf8_val, result, \'?\')",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0xc15,"void test_86(QPDF &, const char *)");
  }
  if (local_60 != local_90) {
LAB_0013a8d2:
    __assert_fail("result == utf8_val",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0xc16,"void test_86(QPDF &, const char *)");
  }
  if (local_60 != 0) {
    iVar3 = bcmp(local_68,local_98,local_60);
    if (iVar3 != 0) goto LAB_0013a8d2;
  }
  cVar2 = QUtil::utf8_to_pdf_doc((string *)&local_98,(string *)&local_68,'?');
  if (cVar2 != '\0') {
    __assert_fail("!QUtil::utf8_to_pdf_doc(utf8_val, result, \'?\')",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0xc17,"void test_86(QPDF &, const char *)");
  }
  iVar3 = std::__cxx11::string::compare((char *)&local_68);
  if (iVar3 != 0) {
    __assert_fail("result == \"?\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0xc18,"void test_86(QPDF &, const char *)");
  }
  QUtil::utf8_to_utf16((string *)&local_b8);
  plVar1 = local_b8;
  if (local_b0 != local_40) {
LAB_0013a8f1:
    __assert_fail("QUtil::utf8_to_utf16(utf8_val) == utf16_val",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0xc19,"void test_86(QPDF &, const char *)");
  }
  if (local_b0 != 0) {
    iVar3 = bcmp(local_b8,local_48,local_b0);
    if (iVar3 != 0) goto LAB_0013a8f1;
  }
  if (plVar1 != local_a8) {
    operator_delete(plVar1,local_a8[0] + 1);
  }
  QUtil::utf16_to_utf8((string *)&local_b8);
  plVar1 = local_b8;
  if (local_b0 != local_90) {
LAB_0013a910:
    __assert_fail("QUtil::utf16_to_utf8(utf16_val) == utf8_val",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0xc1a,"void test_86(QPDF &, const char *)");
  }
  if (local_b0 != 0) {
    iVar3 = bcmp(local_b8,local_98,local_b0);
    if (iVar3 != 0) goto LAB_0013a910;
  }
  if (plVar1 != local_a8) {
    operator_delete(plVar1,local_a8[0] + 1);
  }
  QPDFObjectHandle::newUnicodeString(local_78);
  QPDFObjectHandle::getStringValue_abi_cxx11_();
  plVar1 = local_b8;
  if (local_b0 != local_40) {
LAB_0013a92f:
    __assert_fail("h.getStringValue() == utf16_val",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0xc1c,"void test_86(QPDF &, const char *)");
  }
  if (local_b0 != 0) {
    iVar3 = bcmp(local_b8,local_48,local_b0);
    if (iVar3 != 0) goto LAB_0013a92f;
  }
  if (plVar1 != local_a8) {
    operator_delete(plVar1,local_a8[0] + 1);
  }
  QPDFObjectHandle::getUTF8Value_abi_cxx11_();
  if (local_b0 == local_90) {
    if (local_b0 != 0) {
      iVar3 = bcmp(local_b8,local_98,local_b0);
      if (iVar3 != 0) goto LAB_0013a94e;
    }
    if (local_b8 != local_a8) {
      operator_delete(local_b8,local_a8[0] + 1);
    }
    if (local_70 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_70);
    }
    if (local_68 != &local_58) {
      operator_delete(local_68,CONCAT71(uStack_57,local_58) + 1);
    }
    if (local_48 != &local_38) {
      operator_delete(local_48,CONCAT44(uStack_34,local_38) + 1);
    }
    if (local_98 != local_88) {
      operator_delete(local_98,local_88[0] + 1);
    }
    return;
  }
LAB_0013a94e:
  __assert_fail("h.getUTF8Value() == utf8_val",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                ,0xc1d,"void test_86(QPDF &, const char *)");
}

Assistant:

static void
test_0_1(QPDF& pdf, char const* arg2)
{
    QPDFObjectHandle trailer = pdf.getTrailer();
    QPDFObjectHandle qtest = trailer.getKey("/QTest");

    if (!trailer.hasKey("/QTest")) {
        // This will always happen when /QTest is null because
        // hasKey returns false for null keys regardless of
        // whether the key exists or not.  That way there's never
        // any difference between a key that is present and null
        // and a key that is absent.
        QTC::TC("qpdf", "main QTest implicit");
        std::cout << "/QTest is implicit" << std::endl;
    }

    QTC::TC("qpdf", "main QTest indirect", qtest.isIndirect() ? 1 : 0);
    std::cout << "/QTest is " << (qtest.isIndirect() ? "in" : "") << "direct and has type "
              << qtest.getTypeName() << " (" << qtest.getTypeCode() << ")" << std::endl;

    if (qtest.isNull()) {
        QTC::TC("qpdf", "main QTest null");
        std::cout << "/QTest is null" << std::endl;
    } else if (qtest.isBool()) {
        QTC::TC("qpdf", "main QTest bool", qtest.getBoolValue() ? 1 : 0);
        std::cout << "/QTest is Boolean with value " << (qtest.getBoolValue() ? "true" : "false")
                  << std::endl;
    } else if (qtest.isInteger()) {
        QTC::TC("qpdf", "main QTest int");
        std::cout << "/QTest is an integer with value " << qtest.getIntValue() << std::endl;
    } else if (qtest.isReal()) {
        QTC::TC("qpdf", "main QTest real");
        std::cout << "/QTest is a real number with value " << qtest.getRealValue() << std::endl;
    } else if (qtest.isName()) {
        QTC::TC("qpdf", "main QTest name");
        std::cout << "/QTest is a name with value " << qtest.getName() << std::endl;
    } else if (qtest.isString()) {
        QTC::TC("qpdf", "main QTest string");
        std::cout << "/QTest is a string with value " << qtest.getStringValue() << std::endl;
    } else if (qtest.isArray()) {
        QTC::TC("qpdf", "main QTest array");
        std::cout << "/QTest is an array with " << qtest.getArrayNItems() << " items" << std::endl;
        int i = 0;
        for (auto& iter: qtest.aitems()) {
            QTC::TC("qpdf", "main QTest array indirect", iter.isIndirect() ? 1 : 0);
            std::cout << "  item " << i << " is " << (iter.isIndirect() ? "in" : "") << "direct"
                      << std::endl;
            ++i;
        }
    } else if (qtest.isDictionary()) {
        QTC::TC("qpdf", "main QTest dictionary");
        std::cout << "/QTest is a dictionary" << std::endl;
        for (auto& iter: qtest.ditems()) {
            QTC::TC("qpdf", "main QTest dictionary indirect", iter.second.isIndirect() ? 1 : 0);
            std::cout << "  " << iter.first << " is " << (iter.second.isIndirect() ? "in" : "")
                      << "direct" << std::endl;
        }
    } else if (qtest.isStream()) {
        QTC::TC("qpdf", "main QTest stream");
        std::cout << "/QTest is a stream.  Dictionary: " << qtest.getDict().unparse() << std::endl;

        std::cout << "Raw stream data:" << std::endl;
        std::cout.flush();
        QUtil::binary_stdout();
        auto out = std::make_shared<Pl_StdioFile>("raw", stdout);
        qtest.pipeStreamData(out.get(), 0, qpdf_dl_none);

        std::cout << std::endl << "Uncompressed stream data:" << std::endl;
        if (qtest.pipeStreamData(nullptr, 0, qpdf_dl_all)) {
            std::cout.flush();
            QUtil::binary_stdout();
            out = std::make_shared<Pl_StdioFile>("filtered", stdout);
            qtest.pipeStreamData(out.get(), 0, qpdf_dl_all);
            std::cout << std::endl << "End of stream data" << std::endl;
        } else {
            std::cout << "Stream data is not filterable." << std::endl;
        }
    } else {
        // Should not happen!
        std::cout << "/QTest is an unknown object" << std::endl;
    }

    std::cout << "unparse: " << qtest.unparse() << std::endl
              << "unparseResolved: " << qtest.unparseResolved() << std::endl;
}